

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetra-codec-impl.c
# Opt level: O2

void Residu(tetra_codec *st,Word16 *a,Word16 *x,Word16 *y,Word16 lg)

{
  Word32 WVar1;
  Word16 *pWVar2;
  long lVar3;
  long lVar4;
  Word16 *pWVar5;
  
  pWVar2 = x + -1;
  for (lVar3 = 0; lVar3 != 0x3c; lVar3 = lVar3 + 1) {
    WVar1 = Load_sh(st,x[lVar3],0xc);
    pWVar5 = a + 1;
    for (lVar4 = 0; lVar4 != -10; lVar4 = lVar4 + -1) {
      WVar1 = L_mac0(st,WVar1,*pWVar5,pWVar2[lVar4]);
      pWVar5 = pWVar5 + 1;
    }
    WVar1 = add_sh(st,WVar1,1,0xb);
    WVar1 = L_shl(st,WVar1,4);
    y[lVar3] = (Word16)((uint)WVar1 >> 0x10);
    pWVar2 = pWVar2 + 1;
  }
  return;
}

Assistant:

void Residu(tetra_codec* st, Word16 a[], Word16 x[], Word16 y[], Word16 lg)
{
  Word16 i, j;
  Word32 s;

  for (i = 0; i < lg; i++)
  {
    s = Load_sh(st, x[i], (Word16)12);
    for (j = 1; j <= TSC_pp; j++)
      s = L_mac0(st, s, a[j], x[i-j]);

    s = add_sh(st, s, (Word16)1, (Word16)11);		/* Rounding */
    s = L_shl(st, s, (Word16)4);				/* Saturation */
    y[i] = extract_h(s);
  }
  return;
}